

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

CookieInfo * Curl_cookie_init(Curl_easy *data,char *file,CookieInfo *inc,_Bool newsession)

{
  bool bVar1;
  int iVar2;
  _IO_FILE *p_Var3;
  char *buf;
  char *pcVar4;
  bool bVar5;
  FILE *local_78;
  char *local_70;
  char *pcStack_58;
  _Bool headerline;
  char *lineptr;
  char *line;
  FILE *pFStack_40;
  _Bool fromfile;
  FILE *fp;
  CookieInfo *c;
  _Bool newsession_local;
  CookieInfo *inc_local;
  char *file_local;
  Curl_easy *data_local;
  
  pFStack_40 = (FILE *)0x0;
  bVar1 = true;
  fp = (FILE *)inc;
  if (inc == (CookieInfo *)0x0) {
    fp = (FILE *)(*Curl_ccalloc)(1,0x820);
    if (fp == (FILE *)0x0) {
      return (CookieInfo *)0x0;
    }
    local_70 = file;
    if (file == (char *)0x0) {
      local_70 = "none";
    }
    p_Var3 = (_IO_FILE *)(*Curl_cstrdup)(local_70);
    fp[9]._chain = p_Var3;
    if (fp[9]._chain != (_IO_FILE *)0x0) goto LAB_0011074a;
LAB_00110948:
    (*Curl_cfree)((void *)0x0);
    if (inc == (CookieInfo *)0x0) {
      Curl_cookie_cleanup((CookieInfo *)fp);
    }
    if ((bVar1) && (pFStack_40 != (FILE *)0x0)) {
      fclose(pFStack_40);
    }
    data_local = (Curl_easy *)0x0;
  }
  else {
LAB_0011074a:
    *(undefined1 *)&fp[9]._fileno = 0;
    if ((file == (char *)0x0) || (iVar2 = strcmp(file,"-"), iVar2 != 0)) {
      if ((file == (char *)0x0) || (*file != '\0')) {
        if (file == (char *)0x0) {
          local_78 = (FILE *)0x0;
        }
        else {
          local_78 = fopen64(file,"r");
        }
        pFStack_40 = local_78;
      }
      else {
        pFStack_40 = (FILE *)0x0;
      }
    }
    else {
      pFStack_40 = _stdin;
      bVar1 = false;
    }
    *(_Bool *)&fp[9]._cur_column = newsession;
    if (pFStack_40 != (FILE *)0x0) {
      buf = (char *)(*Curl_cmalloc)(5000);
      if (buf == (char *)0x0) goto LAB_00110948;
      while (pcVar4 = Curl_get_line(buf,5000,(FILE *)pFStack_40), pcVar4 != (char *)0x0) {
        iVar2 = curl_strnequal("Set-Cookie:",buf,0xb);
        pcStack_58 = buf;
        if (iVar2 != 0) {
          pcStack_58 = buf + 0xb;
        }
        while( true ) {
          bVar5 = false;
          if ((*pcStack_58 != '\0') && (bVar5 = true, *pcStack_58 != ' ')) {
            bVar5 = *pcStack_58 == '\t';
          }
          if (!bVar5) break;
          pcStack_58 = pcStack_58 + 1;
        }
        Curl_cookie_add(data,(CookieInfo *)fp,iVar2 != 0,true,pcStack_58,(char *)0x0,(char *)0x0,
                        true);
      }
      (*Curl_cfree)(buf);
      remove_expired((CookieInfo *)fp);
      if (bVar1) {
        fclose(pFStack_40);
      }
    }
    *(undefined1 *)&fp[9]._fileno = 1;
    if (data != (Curl_easy *)0x0) {
      *(ushort *)&(data->state).field_0x514 =
           *(ushort *)&(data->state).field_0x514 & 0xbfff | 0x4000;
    }
    data_local = (Curl_easy *)fp;
  }
  return (CookieInfo *)data_local;
}

Assistant:

struct CookieInfo *Curl_cookie_init(struct Curl_easy *data,
                                    const char *file,
                                    struct CookieInfo *inc,
                                    bool newsession)
{
  struct CookieInfo *c;
  FILE *fp = NULL;
  bool fromfile = TRUE;
  char *line = NULL;

  if(NULL == inc) {
    /* we didn't get a struct, create one */
    c = calloc(1, sizeof(struct CookieInfo));
    if(!c)
      return NULL; /* failed to get memory */
    c->filename = strdup(file?file:"none"); /* copy the name just in case */
    if(!c->filename)
      goto fail; /* failed to get memory */
  }
  else {
    /* we got an already existing one, use that */
    c = inc;
  }
  c->running = FALSE; /* this is not running, this is init */

  if(file && !strcmp(file, "-")) {
    fp = stdin;
    fromfile = FALSE;
  }
  else if(file && !*file) {
    /* points to a "" string */
    fp = NULL;
  }
  else
    fp = file?fopen(file, FOPEN_READTEXT):NULL;

  c->newsession = newsession; /* new session? */

  if(fp) {
    char *lineptr;
    bool headerline;

    line = malloc(MAX_COOKIE_LINE);
    if(!line)
      goto fail;
    while(Curl_get_line(line, MAX_COOKIE_LINE, fp)) {
      if(checkprefix("Set-Cookie:", line)) {
        /* This is a cookie line, get it! */
        lineptr = &line[11];
        headerline = TRUE;
      }
      else {
        lineptr = line;
        headerline = FALSE;
      }
      while(*lineptr && ISBLANK(*lineptr))
        lineptr++;

      Curl_cookie_add(data, c, headerline, TRUE, lineptr, NULL, NULL, TRUE);
    }
    free(line); /* free the line buffer */
    remove_expired(c); /* run this once, not on every cookie */

    if(fromfile)
      fclose(fp);
  }

  c->running = TRUE;          /* now, we're running */
  if(data)
    data->state.cookie_engine = TRUE;

  return c;

fail:
  free(line);
  if(!inc)
    /* Only clean up if we allocated it here, as the original could still be in
     * use by a share handle */
    Curl_cookie_cleanup(c);
  if(fromfile && fp)
    fclose(fp);
  return NULL; /* out of memory */
}